

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

bool IsApplyArgs(ParseNodeCall *callNode)

{
  ParseNode *pPVar1;
  ParseNode *pPVar2;
  ParseNode *pnode;
  bool bVar3;
  PropertyId PVar4;
  ParseNodeBin *pPVar5;
  ParseNodeName *pPVar6;
  
  pPVar1 = callNode->pnodeTarget;
  if ((pPVar1 != (ParseNode *)0x0) && (pPVar1->nop == knopDot)) {
    pPVar2 = callNode->pnodeArgs;
    pPVar5 = ParseNode::AsParseNodeBin(pPVar1);
    pnode = pPVar5->pnode1;
    if ((pnode != (ParseNode *)0x0) && ((pnode->nop == knopDot || (pnode->nop == knopName)))) {
      bVar3 = IsArguments(pnode);
      if (!bVar3) {
        pPVar5 = ParseNode::AsParseNodeBin(pPVar1);
        if (pPVar5->pnode2 != (ParseNode *)0x0) {
          pPVar6 = ParseNode::AsParseNodeName(pPVar5->pnode2);
          PVar4 = ParseNodeName::PropertyIdFromNameNode(pPVar6);
          if ((pPVar2 != (ParseNode *)0x0 && PVar4 == 0x4e) && (pPVar2->nop == knopList)) {
            pPVar5 = ParseNode::AsParseNodeBin(pPVar2);
            pPVar1 = pPVar5->pnode1;
            pPVar5 = ParseNode::AsParseNodeBin(pPVar2);
            if (pPVar1 != (ParseNode *)0x0) {
              pPVar2 = pPVar5->pnode2;
              bVar3 = ByteCodeGenerator::IsThis(pPVar1);
              if ((pPVar2 != (ParseNode *)0x0 && bVar3) && (pPVar2->nop == knopName)) {
                pPVar6 = ParseNode::AsParseNodeName(pPVar2);
                if (pPVar6->sym != (Symbol *)0x0) {
                  pPVar6 = ParseNode::AsParseNodeName(pPVar2);
                  bVar3 = Symbol::IsArguments(pPVar6->sym);
                  return bVar3;
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool IsApplyArgs(ParseNodeCall* callNode)
{
    ParseNode* target = callNode->pnodeTarget;
    ParseNode* args = callNode->pnodeArgs;
    if ((target != nullptr) && (target->nop == knopDot))
    {
        ParseNode* lhsNode = target->AsParseNodeBin()->pnode1;
        if ((lhsNode != nullptr) && ((lhsNode->nop == knopDot) || (lhsNode->nop == knopName)) && !IsArguments(lhsNode))
        {
            ParseNode* nameNode = target->AsParseNodeBin()->pnode2;
            if (nameNode != nullptr)
            {
                bool nameIsApply = nameNode->AsParseNodeName()->PropertyIdFromNameNode() == Js::PropertyIds::apply;
                if (nameIsApply && args != nullptr && args->nop == knopList)
                {
                    ParseNode* arg1 = args->AsParseNodeBin()->pnode1;
                    ParseNode* arg2 = args->AsParseNodeBin()->pnode2;
                    if ((arg1 != nullptr) && ByteCodeGenerator::IsThis(arg1) && (arg2 != nullptr) && (arg2->nop == knopName) && (arg2->AsParseNodeName()->sym != nullptr))
                    {
                        return arg2->AsParseNodeName()->sym->IsArguments();
                    }
                }
            }
        }
    }
    return false;
}